

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-truetype.h
# Opt level: O0

stbtt_uint32 stbtt__cff_int(stbtt__buf *b)

{
  byte bVar1;
  uint uVar2;
  int b0;
  stbtt__buf *b_local;
  
  bVar1 = stbtt__buf_get8(b);
  uVar2 = (uint)bVar1;
  if ((uVar2 < 0x20) || (0xf6 < uVar2)) {
    if ((uVar2 < 0xf7) || (0xfa < uVar2)) {
      if ((uVar2 < 0xfb) || (0xfe < uVar2)) {
        if (uVar2 == 0x1c) {
          b_local._4_4_ = stbtt__buf_get(b,2);
        }
        else {
          if (uVar2 != 0x1d) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-truetype.h"
                          ,0x4bc,"stbtt_uint32 stbtt__cff_int(stbtt__buf *)");
          }
          b_local._4_4_ = stbtt__buf_get(b,4);
        }
      }
      else {
        bVar1 = stbtt__buf_get8(b);
        b_local._4_4_ = ((uVar2 - 0xfb) * -0x100 - (uint)bVar1) - 0x6c;
      }
    }
    else {
      bVar1 = stbtt__buf_get8(b);
      b_local._4_4_ = (uVar2 - 0xf7) * 0x100 + (uint)bVar1 + 0x6c;
    }
  }
  else {
    b_local._4_4_ = uVar2 - 0x8b;
  }
  return b_local._4_4_;
}

Assistant:

static stbtt_uint32 stbtt__cff_int(stbtt__buf *b)
{
   int b0 = stbtt__buf_get8(b);
   if (b0 >= 32 && b0 <= 246)       return b0 - 139;
   else if (b0 >= 247 && b0 <= 250) return (b0 - 247)*256 + stbtt__buf_get8(b) + 108;
   else if (b0 >= 251 && b0 <= 254) return -(b0 - 251)*256 - stbtt__buf_get8(b) - 108;
   else if (b0 == 28)               return stbtt__buf_get16(b);
   else if (b0 == 29)               return stbtt__buf_get32(b);
   STBTT_assert(0);
   return 0;
}